

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O2

void zlib_compress_block(ssh_compressor *sc,uchar *block,int len,uchar **outblock,int *outlen,
                        int minlen)

{
  ssh_compressor *psVar1;
  uchar uVar2;
  ssh_compression_alg *out;
  LZ77InternalContext *st;
  uint uVar3;
  strbuf *psVar4;
  WindowEntry *pWVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uchar *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uchar *puVar18;
  uint uVar19;
  uchar *puVar20;
  int local_18c;
  Match matches [32];
  
  out = sc[-3].vt;
  if ((strbuf *)out->name != (strbuf *)0x0) {
    __assert_fail("!out->outbuf",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",
                  0x269,
                  "void zlib_compress_block(ssh_compressor *, const unsigned char *, int, unsigned char **, int *, int)"
                 );
  }
  psVar1 = sc + -4;
  psVar4 = strbuf_new_nm();
  out->name = (char *)psVar4;
  if (*(_Bool *)((long)&out->compress_new + 4) == true) {
    outbits((Outbuf *)out,0x9c78,0x10);
    *(_Bool *)((long)&out->compress_new + 4) = false;
    outbits((Outbuf *)out,2,3);
  }
  st = (LZ77InternalContext *)psVar1->vt;
  iVar17 = st->npending;
  if (3 < iVar17) {
    __assert_fail("st->npending <= HASHCHARS",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",
                  0xba,"void lz77_compress(struct LZ77Context *, const unsigned char *, int)");
  }
  lVar11 = 0;
  puVar18 = st->pending;
  puVar20 = block;
  while( true ) {
    lVar6 = (long)iVar17;
    if (lVar6 <= lVar11) goto LAB_00128639;
    if ((len + iVar17) - (int)lVar11 < 3) break;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      puVar13 = puVar20 + -lVar6;
      if (lVar11 + lVar9 < lVar6) {
        puVar13 = puVar18;
      }
      *(uchar *)((long)&matches[0].distance + lVar9) = puVar13[lVar9];
    }
    lz77_advance(st,(uchar)matches[0].distance,
                 (((uint)matches[0].distance >> 0x10 & 0xff) * 0x10d +
                 ((uint)matches[0].distance >> 8 & 0xff) * 0x107 +
                 (matches[0].distance & 0xffU) * 0x101) % 0x7f7);
    lVar11 = lVar11 + 1;
    iVar17 = st->npending;
    puVar20 = puVar20 + 1;
    puVar18 = puVar18 + 1;
  }
  for (lVar6 = 0; lVar11 + lVar6 < (long)iVar17; lVar6 = lVar6 + 1) {
    st->pending[lVar6] = st->pending[lVar6 + lVar11];
    iVar17 = st->npending;
  }
LAB_00128639:
  st->npending = iVar17 - (int)lVar11;
  uVar19 = 0;
  local_18c = 0;
  do {
    if (len < 1) {
      outbits((Outbuf *)out,0,7);
      outbits((Outbuf *)out,2,10);
      outbits((Outbuf *)out,2,3);
      while( true ) {
        psVar4 = (strbuf *)out->name;
        uVar7 = psVar4->len;
        if ((ulong)(long)minlen <= uVar7) break;
        outbits((Outbuf *)out,0,7);
        outbits((Outbuf *)out,2,3);
      }
      *outlen = (int)uVar7;
      puVar18 = (uchar *)strbuf_to_str(psVar4);
      *outblock = puVar18;
      out->name = (char *)0x0;
      return;
    }
    if ((uint)len < 3) {
LAB_00128792:
      if ((int)uVar19 < 1) {
        (*(code *)sc[-2].vt)(psVar1);
        iVar17 = 1;
      }
      else {
LAB_001287f6:
        (*(code *)sc[-1].vt)(psVar1,local_18c,uVar19);
        iVar17 = uVar19 - 1;
        uVar19 = 0;
      }
    }
    else {
      uVar3 = lz77_hash(block);
      pWVar5 = (WindowEntry *)(st->hashtab + uVar3);
      uVar7 = 0;
      while( true ) {
        iVar12 = (int)pWVar5->next;
        iVar17 = (int)uVar7;
        if (iVar12 == -1) break;
        iVar8 = ((iVar12 - st->winpos) + 0x8000) % 0x8000;
        lVar11 = 0;
        do {
          if (lVar11 == 3) {
            matches[iVar17].distance = 0x8000 - iVar8;
            matches[iVar17].len = 3;
            uVar7 = (ulong)(iVar17 + 1);
            if (0x1e < iVar17) goto LAB_00128729;
            break;
          }
          uVar3 = iVar8 + -0x8000 + (int)lVar11;
          puVar18 = block + uVar3;
          if ((int)uVar3 < 0) {
            puVar18 = st->data + (st->winpos + iVar8 + (int)lVar11 & 0x7fff);
          }
          puVar20 = block + lVar11;
          lVar11 = lVar11 + 1;
        } while (*puVar20 == *puVar18);
        pWVar5 = st->win + iVar12;
      }
      if (iVar17 < 1) goto LAB_00128792;
LAB_00128729:
      uVar10 = 3;
      do {
        uVar3 = len;
        if ((uint)len <= uVar10) break;
        uVar3 = (uint)uVar10;
        uVar14 = 0;
        uVar15 = uVar7;
        if ((int)uVar7 < 1) {
          uVar15 = 0;
        }
        uVar7 = 0;
        for (; iVar17 = (int)uVar7, uVar15 != uVar14; uVar14 = uVar14 + 1) {
          uVar16 = uVar3 - matches[uVar14].distance;
          if ((int)uVar16 < 0) {
            puVar18 = st->data + (uVar16 + st->winpos & 0x7fff);
          }
          else {
            puVar18 = block + uVar16;
          }
          if (block[uVar10] == *puVar18) {
            uVar7 = (ulong)(iVar17 + 1);
            matches[iVar17] = matches[uVar14];
          }
        }
        uVar10 = uVar10 + 1;
      } while (iVar17 != 0);
      matches[0].len = uVar3;
      if (0 < (int)uVar19) {
        if ((int)(uVar19 + 1) < (int)uVar3) {
          (*(code *)sc[-2].vt)(psVar1);
          goto LAB_001287df;
        }
        goto LAB_001287f6;
      }
LAB_001287df:
      local_18c = matches[0].distance;
      iVar17 = 1;
      uVar19 = uVar3;
    }
    for (; 0 < iVar17; iVar17 = iVar17 + -1) {
      if (len < 3) {
        iVar12 = st->npending;
        if (2 < (long)iVar12) {
          __assert_fail("st->npending < HASHCHARS",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c"
                        ,0x140,
                        "void lz77_compress(struct LZ77Context *, const unsigned char *, int)");
        }
        uVar2 = *block;
        st->npending = iVar12 + 1;
        st->pending[iVar12] = uVar2;
      }
      else {
        uVar2 = *block;
        iVar12 = lz77_hash(block);
        lz77_advance(st,uVar2,iVar12);
      }
      block = block + 1;
      len = len - 1;
    }
  } while( true );
}

Assistant:

void zlib_compress_block(ssh_compressor *sc,
                         const unsigned char *block, int len,
                         unsigned char **outblock, int *outlen,
                         int minlen)
{
    struct ssh_zlib_compressor *comp =
        container_of(sc, struct ssh_zlib_compressor, sc);
    struct Outbuf *out = (struct Outbuf *) comp->ectx.userdata;
    bool in_block;

    assert(!out->outbuf);
    out->outbuf = strbuf_new_nm();

    /*
     * If this is the first block, output the Zlib (RFC1950) header
     * bytes 78 9C. (Deflate compression, 32K window size, default
     * algorithm.)
     */
    if (out->firstblock) {
        outbits(out, 0x9C78, 16);
        out->firstblock = false;

        in_block = false;
    } else
        in_block = true;

    if (!in_block) {
        /*
         * Start a Deflate (RFC1951) fixed-trees block. We
         * transmit a zero bit (BFINAL=0), followed by a zero
         * bit and a one bit (BTYPE=01). Of course these are in
         * the wrong order (01 0).
         */
        outbits(out, 2, 3);
    }

    /*
     * Do the compression.
     */
    lz77_compress(&comp->ectx, block, len);

    /*
     * End the block (by transmitting code 256, which is
     * 0000000 in fixed-tree mode), and transmit some empty
     * blocks to ensure we have emitted the byte containing the
     * last piece of genuine data. There are three ways we can
     * do this:
     *
     *  - Minimal flush. Output end-of-block and then open a
     *    new static block. This takes 9 bits, which is
     *    guaranteed to flush out the last genuine code in the
     *    closed block; but allegedly zlib can't handle it.
     *
     *  - Zlib partial flush. Output EOB, open and close an
     *    empty static block, and _then_ open the new block.
     *    This is the best zlib can handle.
     *
     *  - Zlib sync flush. Output EOB, then an empty
     *    _uncompressed_ block (000, then sync to byte
     *    boundary, then send bytes 00 00 FF FF). Then open the
     *    new block.
     *
     * For the moment, we will use Zlib partial flush.
     */
    outbits(out, 0, 7);        /* close block */
    outbits(out, 2, 3 + 7);    /* empty static block */
    outbits(out, 2, 3);        /* open new block */

    /*
     * If we've been asked to pad out the compressed data until it's
     * at least a given length, do so by emitting further empty static
     * blocks.
     */
    while (out->outbuf->len < minlen) {
        outbits(out, 0, 7);            /* close block */
        outbits(out, 2, 3);            /* open new static block */
    }

    *outlen = out->outbuf->len;
    *outblock = (unsigned char *)strbuf_to_str(out->outbuf);
    out->outbuf = NULL;
}